

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cVertexAttribBindingTests.cpp
# Opt level: O2

long __thiscall
glcts::anon_unknown_0::AdvancedLargeStrideAndOffsetsNewAndLegacyAPI::Run
          (AdvancedLargeStrideAndOffsetsNewAndLegacyAPI *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLuint GVar2;
  GLuint shader;
  ostream *poVar3;
  void *pvVar4;
  Vector<float,_2> *v;
  long lVar5;
  char *glsl_fs;
  GLint blocksFS;
  Vec2 i0_v1_a0;
  Vector<unsigned_int,_2> local_278;
  Vector<unsigned_int,_2> local_270;
  Vector<unsigned_int,_2> local_268;
  Vector<unsigned_int,_2> local_260;
  UVec2 i1_v1_a2;
  UVec2 i1_v0_a2;
  UVec2 i0_v1_a2;
  Vector<int,_2> local_240;
  Vector<int,_2> local_238;
  Vector<int,_2> local_230;
  Vector<int,_2> local_228;
  IVec2 i1_v1_a1;
  IVec2 i1_v0_a1;
  IVec2 i0_v1_a1;
  Vector<float,_2> local_208;
  Vector<float,_2> local_200;
  Vector<float,_2> local_1f8;
  Vector<float,_2> local_1f0;
  Vec2 i1_v1_a0;
  Vec2 i1_v0_a0;
  char *glsl_vs;
  UVec2 i0_v0_a2;
  IVec2 i0_v0_a1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  
  this_00 = &(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegerv(this_00,0x90d6,(GLint *)&glsl_fs);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x90da,&blocksFS);
  if (((int)glsl_fs < 2) || (blocksFS < 2)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&data);
    poVar3 = std::operator<<((ostream *)&data,"Required ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
    poVar3 = std::operator<<(poVar3," VS storage blocks but only ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)glsl_fs);
    poVar3 = std::operator<<(poVar3," available.");
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(poVar3,"Required ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
    poVar3 = std::operator<<(poVar3," FS storage blocks but only ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,blocksFS);
    poVar3 = std::operator<<(poVar3," available.");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::stringbuf::str();
    deqp::SubcaseBase::OutputNotSupported((SubcaseBase *)this,(string *)&glsl_vs);
    std::__cxx11::string::~string((string *)&glsl_vs);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&data);
    return 0x10;
  }
  glsl_vs = 
  "#version 310 es\nlayout(location = 0) in vec2 vs_in_attrib0;\nlayout(location = 4) in ivec2 vs_in_attrib1;\nlayout(location = 8) in uvec2 vs_in_attrib2;\nlayout(location = 15) in float vs_in_attrib3;\nlayout(std430, binding = 1) buffer Output {\n  vec2 attrib0[4];\n  ivec2 attrib1[4];\n  uvec2 attrib2[4];\n  float attrib3[4];\n} g_output;\nvoid main() {\n  g_output.attrib0[2 * gl_InstanceID + gl_VertexID] = vs_in_attrib0;\n  g_output.attrib1[2 * gl_InstanceID + gl_VertexID] = vs_in_attrib1;\n  g_output.attrib2[2 * gl_InstanceID + gl_VertexID] = vs_in_attrib2;\n  g_output.attrib3[2 * gl_InstanceID + gl_VertexID] = vs_in_attrib3;\n}"
  ;
  glsl_fs = 
  "#version 310 es\nprecision mediump float;\nout vec4 fs_out_color;\nvoid main() {\n  fs_out_color = vec4(0.5,0.5,0.5,1.0);\n}"
  ;
  if (this->pipeline == true) {
    GVar2 = glu::CallLogWrapper::glCreateShaderProgramv(this_00,0x8b31,1,&glsl_vs);
    this->m_vsp = GVar2;
    GVar2 = glu::CallLogWrapper::glCreateShaderProgramv(this_00,0x8b30,1,&glsl_fs);
    this->m_fsp = GVar2;
    bVar1 = VertexAttribBindingBase::CheckProgram(&this->super_VertexAttribBindingBase,this->m_vsp);
    if (!bVar1) {
      return -1;
    }
    bVar1 = VertexAttribBindingBase::CheckProgram(&this->super_VertexAttribBindingBase,this->m_fsp);
    if (!bVar1) {
      return -1;
    }
    glu::CallLogWrapper::glUseProgramStages(this_00,this->m_ppo,1,this->m_vsp);
    glu::CallLogWrapper::glUseProgramStages(this_00,this->m_ppo,2,this->m_fsp);
  }
  else {
    GVar2 = glu::CallLogWrapper::glCreateProgram(this_00);
    this->m_ppo = GVar2;
    GVar2 = glu::CallLogWrapper::glCreateShader(this_00,0x8b31);
    shader = glu::CallLogWrapper::glCreateShader(this_00,0x8b30);
    glu::CallLogWrapper::glShaderSource(this_00,GVar2,1,&glsl_vs,(GLint *)0x0);
    glu::CallLogWrapper::glShaderSource(this_00,shader,1,&glsl_fs,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader(this_00,GVar2);
    glu::CallLogWrapper::glCompileShader(this_00,shader);
    glu::CallLogWrapper::glAttachShader(this_00,this->m_ppo,GVar2);
    glu::CallLogWrapper::glAttachShader(this_00,this->m_ppo,shader);
    glu::CallLogWrapper::glDeleteShader(this_00,GVar2);
    glu::CallLogWrapper::glDeleteShader(this_00,shader);
    glu::CallLogWrapper::glLinkProgram(this_00,this->m_ppo);
    bVar1 = VertexAttribBindingBase::CheckProgram(&this->super_VertexAttribBindingBase,this->m_ppo);
    if (!bVar1) {
      return -1;
    }
  }
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vbo);
  glu::CallLogWrapper::glBufferData(this_00,0x8892,100000,(void *)0x0,0x88e4);
  pvVar4 = glu::CallLogWrapper::glMapBufferRange(this_00,0x8892,0,100000,2);
  *(undefined8 *)((long)pvVar4 + 0x10) = 0x400000003f800000;
  *(undefined8 *)((long)pvVar4 + 0x810) = 0x4080000040400000;
  *(undefined8 *)((long)pvVar4 + 0x80) = 0x600000005;
  *(undefined8 *)((long)pvVar4 + 0x880) = 0x800000007;
  *(undefined8 *)((long)pvVar4 + 0x400) = 0xa00000009;
  *(undefined8 *)((long)pvVar4 + 0xc00) = 0xc0000000b;
  *(undefined4 *)((long)pvVar4 + 0x7f0) = 0x41500000;
  *(undefined4 *)((long)pvVar4 + 0xff0) = 0x41600000;
  glu::CallLogWrapper::glUnmapBuffer(this_00,0x8892);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
  glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,0,2,0x1406,'\0',0x10);
  glu::CallLogWrapper::glVertexAttribIFormat(this_00,8,2,0x1405,0x400);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,0xf,1,0x1406,'\0',0x7f0);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vbo);
  glu::CallLogWrapper::glVertexAttribIPointer(this_00,4,2,0x1404,0x800,(void *)0x80);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
  glu::CallLogWrapper::glVertexAttribBinding(this_00,8,3);
  glu::CallLogWrapper::glVertexAttribBinding(this_00,0xf,3);
  glu::CallLogWrapper::glBindVertexBuffer(this_00,0,this->m_vbo,0,0x800);
  glu::CallLogWrapper::glBindVertexBuffer(this_00,3,this->m_vbo,0,0x800);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,4);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,8);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0xf);
  glu::CallLogWrapper::glBindVertexArray(this_00,0);
  blocksFS = CONCAT31(blocksFS._1_3_,0xff);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&data,0x70,(value_type_conflict5 *)&blocksFS,(allocator_type *)&i0_v1_a0);
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,1,this->m_ssbo);
  glu::CallLogWrapper::glBufferData
            (this_00,0x90d2,
             (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,0x88e8);
  glu::CallLogWrapper::glEnable(this_00,0x8c89);
  if (this->pipeline == true) {
    glu::CallLogWrapper::glBindProgramPipeline(this_00,this->m_ppo);
  }
  else {
    glu::CallLogWrapper::glUseProgram(this_00,this->m_ppo);
  }
  glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
  glu::CallLogWrapper::glDrawArraysInstanced(this_00,0,0,2,2);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_ssbo);
  v = (Vector<float,_2> *)
      glu::CallLogWrapper::glMapBufferRange
                (this_00,0x90d2,0,
                 (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,1);
  tcu::Vector<float,_2>::Vector((Vector<float,_2> *)&blocksFS,v);
  tcu::Vector<float,_2>::Vector(&i0_v1_a0,v + 1);
  tcu::Vector<float,_2>::Vector(&i1_v0_a0,v + 2);
  tcu::Vector<float,_2>::Vector(&i1_v1_a0,v + 3);
  tcu::Vector<float,_2>::Vector(&local_1f0,(Vector<float,_2> *)&blocksFS);
  if ((((local_1f0.m_data[0] == 1.0) && (!NAN(local_1f0.m_data[0]))) && (local_1f0.m_data[1] == 2.0)
      ) && (!NAN(local_1f0.m_data[1]))) {
    tcu::Vector<float,_2>::Vector(&local_1f8,&i0_v1_a0);
    if (((local_1f8.m_data[0] == 3.0) && (!NAN(local_1f8.m_data[0]))) &&
       ((local_1f8.m_data[1] == 4.0 && (!NAN(local_1f8.m_data[1]))))) {
      tcu::Vector<float,_2>::Vector(&local_200,&i1_v0_a0);
      if (((local_200.m_data[0] == 1.0) && (!NAN(local_200.m_data[0]))) &&
         ((local_200.m_data[1] == 2.0 && (!NAN(local_200.m_data[1]))))) {
        tcu::Vector<float,_2>::Vector(&local_208,&i1_v1_a0);
        if ((((local_208.m_data[0] == 3.0) && (!NAN(local_208.m_data[0]))) &&
            (local_208.m_data[1] == 4.0)) && (!NAN(local_208.m_data[1]))) {
          tcu::Vector<int,_2>::Vector(&i0_v0_a1,(Vector<int,_2> *)(v + 4));
          tcu::Vector<int,_2>::Vector(&i0_v1_a1,(Vector<int,_2> *)(v + 5));
          tcu::Vector<int,_2>::Vector(&i1_v0_a1,(Vector<int,_2> *)(v + 6));
          tcu::Vector<int,_2>::Vector(&i1_v1_a1,(Vector<int,_2> *)(v + 7));
          tcu::Vector<int,_2>::Vector(&local_228,&i0_v0_a1);
          if (((((local_228.m_data[0] == 5) && (local_228.m_data[1] == 6)) &&
               ((tcu::Vector<int,_2>::Vector(&local_230,&i0_v1_a1), local_230.m_data[0] == 7 &&
                ((local_230.m_data[1] == 8 &&
                 (tcu::Vector<int,_2>::Vector(&local_238,&i1_v0_a1), local_238.m_data[0] == 5))))))
              && (local_238.m_data[1] == 6)) &&
             ((tcu::Vector<int,_2>::Vector(&local_240,&i1_v1_a1), local_240.m_data[0] == 7 &&
              (local_240.m_data[1] == 8)))) {
            tcu::Vector<unsigned_int,_2>::Vector(&i0_v0_a2,(Vector<unsigned_int,_2> *)(v + 8));
            tcu::Vector<unsigned_int,_2>::Vector(&i0_v1_a2,(Vector<unsigned_int,_2> *)(v + 9));
            tcu::Vector<unsigned_int,_2>::Vector(&i1_v0_a2,(Vector<unsigned_int,_2> *)(v + 10));
            tcu::Vector<unsigned_int,_2>::Vector(&i1_v1_a2,(Vector<unsigned_int,_2> *)(v + 0xb));
            tcu::Vector<unsigned_int,_2>::Vector(&local_260,&i0_v0_a2);
            if ((((local_260.m_data[0] == 9) &&
                 (((local_260.m_data[1] == 10 &&
                   (tcu::Vector<unsigned_int,_2>::Vector(&local_268,&i0_v1_a2),
                   local_268.m_data[0] == 0xb)) && (local_268.m_data[1] == 0xc)))) &&
                (((((tcu::Vector<unsigned_int,_2>::Vector(&local_270,&i1_v0_a2),
                    local_270.m_data[0] == 9 && (local_270.m_data[1] == 10)) &&
                   (tcu::Vector<unsigned_int,_2>::Vector(&local_278,&i1_v1_a2),
                   local_278.m_data[0] == 0xb)) &&
                  ((local_278.m_data[1] == 0xc && (v[0xc].m_data[0] == 13.0)))) &&
                 (((!NAN(v[0xc].m_data[0]) &&
                   (((v[0xc].m_data[1] == 14.0 && (!NAN(v[0xc].m_data[1]))) &&
                    (v[0xd].m_data[0] == 13.0)))) &&
                  ((!NAN(v[0xd].m_data[0]) && (v[0xd].m_data[1] == 14.0)))))))) &&
               (!NAN(v[0xd].m_data[1]))) {
              glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
              lVar5 = 0;
              goto LAB_00c1f6b8;
            }
          }
        }
      }
    }
  }
  lVar5 = -1;
LAB_00c1f6b8:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return lVar5;
}

Assistant:

virtual long Run()
	{
		if (!IsSSBOInVSFSAvailable(2))
			return NOT_SUPPORTED;
		const char* const glsl_vs =
			"#version 310 es" NL "layout(location = 0) in vec2 vs_in_attrib0;" NL
			"layout(location = 4) in ivec2 vs_in_attrib1;" NL "layout(location = 8) in uvec2 vs_in_attrib2;" NL
			"layout(location = 15) in float vs_in_attrib3;" NL "layout(std430, binding = 1) buffer Output {" NL
			"  vec2 attrib0[4];" NL "  ivec2 attrib1[4];" NL "  uvec2 attrib2[4];" NL "  float attrib3[4];" NL
			"} g_output;" NL "void main() {" NL
			"  g_output.attrib0[2 * gl_InstanceID + gl_VertexID] = vs_in_attrib0;" NL
			"  g_output.attrib1[2 * gl_InstanceID + gl_VertexID] = vs_in_attrib1;" NL
			"  g_output.attrib2[2 * gl_InstanceID + gl_VertexID] = vs_in_attrib2;" NL
			"  g_output.attrib3[2 * gl_InstanceID + gl_VertexID] = vs_in_attrib3;" NL "}";
		const char* const glsl_fs = "#version 310 es" NL "precision mediump float;" NL "out vec4 fs_out_color;" NL
									"void main() {" NL "  fs_out_color = vec4(0.5,0.5,0.5,1.0);" NL "}";
		if (pipeline)
		{
			m_vsp = glCreateShaderProgramv(GL_VERTEX_SHADER, 1, &glsl_vs);
			m_fsp = glCreateShaderProgramv(GL_FRAGMENT_SHADER, 1, &glsl_fs);
			if (!CheckProgram(m_vsp) || !CheckProgram(m_fsp))
				return ERROR;
			glUseProgramStages(m_ppo, GL_VERTEX_SHADER_BIT, m_vsp);
			glUseProgramStages(m_ppo, GL_FRAGMENT_SHADER_BIT, m_fsp);
		}
		else
		{
			m_ppo			 = glCreateProgram();
			const GLuint sh  = glCreateShader(GL_VERTEX_SHADER);
			const GLuint fsh = glCreateShader(GL_FRAGMENT_SHADER);
			glShaderSource(sh, 1, &glsl_vs, NULL);
			glShaderSource(fsh, 1, &glsl_fs, NULL);
			glCompileShader(sh);
			glCompileShader(fsh);
			glAttachShader(m_ppo, sh);
			glAttachShader(m_ppo, fsh);
			glDeleteShader(sh);
			glDeleteShader(fsh);
			glLinkProgram(m_ppo);
			if (!CheckProgram(m_ppo))
				return ERROR;
		}

		/* vbo */
		{
			glBindBuffer(GL_ARRAY_BUFFER, m_vbo);
			glBufferData(GL_ARRAY_BUFFER, 100000, NULL, GL_STATIC_DRAW);
			GLubyte* ptr = static_cast<GLubyte*>(glMapBufferRange(GL_ARRAY_BUFFER, 0, 100000, GL_MAP_WRITE_BIT));
			// attrib0
			*reinterpret_cast<Vec2*>(&ptr[16 + 0 * 2048]) = Vec2(1.0f, 2.0f);
			*reinterpret_cast<Vec2*>(&ptr[16 + 1 * 2048]) = Vec2(3.0f, 4.0f);
			// attrib1
			*reinterpret_cast<IVec2*>(&ptr[128 + 0 * 2048]) = IVec2(5, 6);
			*reinterpret_cast<IVec2*>(&ptr[128 + 1 * 2048]) = IVec2(7, 8);
			// attrib2
			*reinterpret_cast<UVec2*>(&ptr[1024 + 0 * 2048]) = UVec2(9, 10);
			*reinterpret_cast<UVec2*>(&ptr[1024 + 1 * 2048]) = UVec2(11, 12);
			// attrib3
			*reinterpret_cast<float*>(&ptr[2032 + 0 * 2048]) = 13.0f;
			*reinterpret_cast<float*>(&ptr[2032 + 1 * 2048]) = 14.0f;
			glUnmapBuffer(GL_ARRAY_BUFFER);
			glBindBuffer(GL_ARRAY_BUFFER, 0);
		}
		// vao
		glBindVertexArray(m_vao);
		glVertexAttribFormat(0, 2, GL_FLOAT, GL_FALSE, 16);
		glVertexAttribIFormat(8, 2, GL_UNSIGNED_INT, 1024);
		glVertexAttribFormat(15, 1, GL_FLOAT, GL_FALSE, 2032);
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo);
		glVertexAttribIPointer(4, 2, GL_INT, 2048, reinterpret_cast<void*>(128));
		glBindBuffer(GL_ARRAY_BUFFER, 0);
		glVertexAttribBinding(8, 3);
		glVertexAttribBinding(15, 3);
		glBindVertexBuffer(0, m_vbo, 0, 2048);
		glBindVertexBuffer(3, m_vbo, 0, 2048);
		glEnableVertexAttribArray(0);
		glEnableVertexAttribArray(4);
		glEnableVertexAttribArray(8);
		glEnableVertexAttribArray(15);
		glBindVertexArray(0);

		// ssbo
		std::vector<GLubyte> data((sizeof(Vec2) + sizeof(IVec2) + sizeof(UVec2) + sizeof(float)) * 4, 0xff);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_ssbo);
		glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)data.size(), &data[0], GL_DYNAMIC_DRAW);

		glEnable(GL_RASTERIZER_DISCARD);
		if (pipeline)
			glBindProgramPipeline(m_ppo);
		else
			glUseProgram(m_ppo);
		glBindVertexArray(m_vao);
		glDrawArraysInstanced(GL_POINTS, 0, 2, 2);

		/* */
		{
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_ssbo);
			GLubyte* ptr = static_cast<GLubyte*>(
				glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, (GLsizeiptr)data.size(), GL_MAP_READ_BIT));
			// attrib0
			Vec2 i0_v0_a0 = *reinterpret_cast<Vec2*>(&ptr[0]);
			Vec2 i0_v1_a0 = *reinterpret_cast<Vec2*>(&ptr[8]);
			Vec2 i1_v0_a0 = *reinterpret_cast<Vec2*>(&ptr[16]);
			Vec2 i1_v1_a0 = *reinterpret_cast<Vec2*>(&ptr[24]);
			if (!IsEqual(i0_v0_a0, Vec2(1.0f, 2.0f)))
				return ERROR;
			if (!IsEqual(i0_v1_a0, Vec2(3.0f, 4.0f)))
				return ERROR;
			if (!IsEqual(i1_v0_a0, Vec2(1.0f, 2.0f)))
				return ERROR;
			if (!IsEqual(i1_v1_a0, Vec2(3.0f, 4.0f)))
				return ERROR;
			// attrib1
			IVec2 i0_v0_a1 = *reinterpret_cast<IVec2*>(&ptr[32]);
			IVec2 i0_v1_a1 = *reinterpret_cast<IVec2*>(&ptr[40]);
			IVec2 i1_v0_a1 = *reinterpret_cast<IVec2*>(&ptr[48]);
			IVec2 i1_v1_a1 = *reinterpret_cast<IVec2*>(&ptr[56]);
			if (!IsEqual(i0_v0_a1, IVec2(5, 6)))
				return ERROR;
			if (!IsEqual(i0_v1_a1, IVec2(7, 8)))
				return ERROR;
			if (!IsEqual(i1_v0_a1, IVec2(5, 6)))
				return ERROR;
			if (!IsEqual(i1_v1_a1, IVec2(7, 8)))
				return ERROR;
			// attrib2
			UVec2 i0_v0_a2 = *reinterpret_cast<UVec2*>(&ptr[64]);
			UVec2 i0_v1_a2 = *reinterpret_cast<UVec2*>(&ptr[72]);
			UVec2 i1_v0_a2 = *reinterpret_cast<UVec2*>(&ptr[80]);
			UVec2 i1_v1_a2 = *reinterpret_cast<UVec2*>(&ptr[88]);
			if (!IsEqual(i0_v0_a2, UVec2(9, 10)))
				return ERROR;
			if (!IsEqual(i0_v1_a2, UVec2(11, 12)))
				return ERROR;
			if (!IsEqual(i1_v0_a2, UVec2(9, 10)))
				return ERROR;
			if (!IsEqual(i1_v1_a2, UVec2(11, 12)))
				return ERROR;
			// attrib3
			float i0_v0_a3 = *reinterpret_cast<float*>(&ptr[96]);
			float i0_v1_a3 = *reinterpret_cast<float*>(&ptr[100]);
			float i1_v0_a3 = *reinterpret_cast<float*>(&ptr[104]);
			float i1_v1_a3 = *reinterpret_cast<float*>(&ptr[108]);
			if (i0_v0_a3 != 13.0f)
				return ERROR;
			if (i0_v1_a3 != 14.0f)
				return ERROR;
			if (i1_v0_a3 != 13.0f)
				return ERROR;
			if (i1_v1_a3 != 14.0f)
				return ERROR;
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		}
		return NO_ERROR;
	}